

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

void __thiscall
duckdb::UncompressedStringStorage::WriteStringMemory
          (UncompressedStringStorage *this,ColumnSegment *segment,string_t string,
          block_id_t *result_block,int32_t *result_offset)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  BlockManager *pBVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> _Var3;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> __ptr;
  StringBlock *__ptr_00;
  data_ptr_t pdVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  BufferManager *pBVar7;
  pointer pSVar8;
  idx_t iVar9;
  idx_t iVar10;
  BlockHandle *pBVar11;
  ulong uVar12;
  void *__src;
  ulong uVar13;
  templated_unique_single_t new_block;
  BufferHandle handle;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> local_a0;
  shared_ptr<duckdb::BlockHandle,_true> local_98;
  undefined8 local_80;
  void *local_78;
  BufferHandle local_70;
  BufferHandle local_58;
  block_id_t *local_40;
  block_id_t *local_38;
  
  local_78 = string.value._0_8_;
  local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_80 = segment;
  BufferHandle::BufferHandle(&local_58);
  pBVar7 = BufferManager::GetBufferManager(*(DatabaseInstance **)(this + 0x20));
  local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)(this + 0xd8);
  local_40 = result_block;
  local_38 = string.value._8_8_;
  optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
            ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_70);
  peVar5 = local_70.handle.internal.
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = &((local_70.handle.internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
             super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar13 = (ulong)((int)segment + 4);
  if (((local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
      super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
             operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                         *)this_00);
    iVar9 = pSVar8->offset;
    pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
             operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                         *)this_00);
    if (iVar9 + uVar13 < pSVar8->size) {
      pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
               operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                           *)this_00);
      (*pBVar7->_vptr_BufferManager[7])(&local_70,pBVar7,pSVar8);
      BufferHandle::operator=(&local_58,&local_70);
      BufferHandle::~BufferHandle(&local_70);
      goto LAB_0057526e;
    }
  }
  pBVar11 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                      ((shared_ptr<duckdb::BlockHandle,_true> *)(this + 0xa8));
  pBVar1 = pBVar11->block_manager;
  iVar9 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar10 = optional_idx::GetIndex(&pBVar1->block_header_size);
  uVar12 = iVar9 - iVar10;
  if (iVar9 - iVar10 < uVar13) {
    uVar12 = uVar13;
  }
  local_a0._M_head_impl = (StringBlock *)operator_new(0x28);
  (local_a0._M_head_impl)->offset = 0;
  (local_a0._M_head_impl)->size = 0;
  ((local_a0._M_head_impl)->block).internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((local_a0._M_head_impl)->block).internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_a0._M_head_impl)->next).
  super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
  super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
  super__Head_base<0UL,_duckdb::StringBlock_*,_false> =
       (_Head_base<0UL,_duckdb::StringBlock_*,_false>)0x0;
  pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)&local_a0);
  pSVar8->offset = 0;
  pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)&local_a0);
  pSVar8->size = uVar12;
  (*pBVar7->_vptr_BufferManager[4])(&local_70,pBVar7,8,uVar12,0);
  BufferHandle::operator=(&local_58,&local_70);
  BufferHandle::~BufferHandle(&local_70);
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&local_98,&local_58.handle);
  pBVar11 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&local_98);
  peVar2 = (element_type *)pBVar11->block_id;
  local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::operator*
                 ((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true> *
                  )&local_a0);
  local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  ::std::
  _Hashtable<long,std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>,std::allocator<std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<long,duckdb::StringBlock&>>
            ((_Hashtable<long,std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>,std::allocator<std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&peVar5->block_manager);
  pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)&local_a0);
  _Var6._M_pi = local_98.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar5 = local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (pSVar8->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pSVar8->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar5;
  (pSVar8->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)&local_a0);
  _Var3._M_head_impl = (StringBlock *)this_00->_M_pi;
  this_00->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __ptr._M_head_impl =
       (pSVar8->next).
       super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
       super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
       super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl;
  (pSVar8->next).super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>.
  _M_t.super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
  super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (__ptr._M_head_impl != (StringBlock *)0x0) {
    ::std::default_delete<duckdb::StringBlock>::operator()
              ((default_delete<duckdb::StringBlock> *)&pSVar8->next,__ptr._M_head_impl);
  }
  _Var3._M_head_impl = local_a0._M_head_impl;
  local_a0._M_head_impl = (StringBlock *)0x0;
  __ptr_00 = (StringBlock *)this_00->_M_pi;
  this_00->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_head_impl;
  if (__ptr_00 != (StringBlock *)0x0) {
    ::std::default_delete<duckdb::StringBlock>::operator()
              ((default_delete<duckdb::StringBlock> *)this_00,__ptr_00);
  }
  if (local_a0._M_head_impl != (StringBlock *)0x0) {
    ::std::default_delete<duckdb::StringBlock>::operator()
              ((default_delete<duckdb::StringBlock> *)&local_a0,local_a0._M_head_impl);
  }
LAB_0057526e:
  pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)this_00);
  pBVar11 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pSVar8->block);
  *local_38 = pBVar11->block_id;
  pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)this_00);
  *(int *)local_40 = (int)pSVar8->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.node);
  pdVar4 = (local_58.node.ptr)->buffer;
  pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)this_00);
  iVar9 = pSVar8->offset;
  *(undefined4 *)(pdVar4 + iVar9) = (undefined4)local_80;
  __src = local_78;
  if (((ulong)local_80 & 0xffffffff) < 0xd) {
    __src = (void *)((long)&local_80 + 4);
  }
  switchD_00b1422a::default(pdVar4 + iVar9 + 4,__src,(ulong)local_80 & 0xffffffff);
  pSVar8 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)this_00);
  pSVar8->offset = pSVar8->offset + uVar13;
  BufferHandle::~BufferHandle(&local_58);
  if (local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void UncompressedStringStorage::WriteStringMemory(ColumnSegment &segment, string_t string, block_id_t &result_block,
                                                  int32_t &result_offset) {
	auto total_length = UnsafeNumericCast<uint32_t>(string.GetSize() + sizeof(uint32_t));
	shared_ptr<BlockHandle> block;
	BufferHandle handle;

	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();
	// check if the string fits in the current block
	if (!state.head || state.head->offset + total_length >= state.head->size) {
		// string does not fit, allocate space for it
		// create a new string block
		auto alloc_size = MaxValue<idx_t>(total_length, segment.GetBlockManager().GetBlockSize());
		auto new_block = make_uniq<StringBlock>();
		new_block->offset = 0;
		new_block->size = alloc_size;
		// allocate an in-memory buffer for it
		handle = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, alloc_size, false);
		block = handle.GetBlockHandle();
		state.overflow_blocks.insert(make_pair(block->BlockId(), reference<StringBlock>(*new_block)));
		new_block->block = std::move(block);
		new_block->next = std::move(state.head);
		state.head = std::move(new_block);
	} else {
		// string fits, copy it into the current block
		handle = buffer_manager.Pin(state.head->block);
	}

	result_block = state.head->block->BlockId();
	result_offset = UnsafeNumericCast<int32_t>(state.head->offset);

	// copy the string and the length there
	auto ptr = handle.Ptr() + state.head->offset;
	Store<uint32_t>(UnsafeNumericCast<uint32_t>(string.GetSize()), ptr);
	ptr += sizeof(uint32_t);
	memcpy(ptr, string.GetData(), string.GetSize());
	state.head->offset += total_length;
}